

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O1

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::processArg
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,StringRef *arg)

{
  SwitchKind switchKind;
  bool bVar1;
  bool bVar2;
  SwitchInfo *pSVar3;
  C *pCVar4;
  size_t first;
  ArgKind argKind;
  String switchName;
  String value;
  StringRef local_a8;
  CmdLineParser *local_88;
  ulong local_80;
  StringRef local_78;
  StringRef local_58;
  
  if (((this->super_CmdLineParserRoot).m_flags & 1) != 0) {
    bVar2 = CmdLineParser::onValue((CmdLineParser *)this,arg);
    return bVar2;
  }
  local_78.m_length._0_1_ = 0;
  local_78.m_length._1_7_ = 0;
  local_78.m_isNullTerminated = false;
  local_78.m_p = (C *)0x0;
  local_78.m_hdr._0_1_ = 0;
  local_78.m_hdr._1_7_ = 0;
  local_58.m_length._0_1_ = 0;
  local_58._17_8_ = 0;
  local_58.m_p = (C *)0x0;
  local_58.m_hdr._0_1_ = 0;
  local_58.m_hdr._1_7_ = 0;
  local_80 = arg->m_length;
  argKind = ArgKind_Value;
  if ((1 < local_80) && (argKind = ArgKind_Value, *arg->m_p == '-')) {
    argKind = (arg->m_p[1] == '-') + ArgKind_CharSwitch;
  }
  if (argKind == ArgKind_Value) {
    bVar2 = processValue(this,arg);
  }
  else if (argKind == ArgKind_StringSwitch) {
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
              (&local_a8,arg,2,0xffffffffffffffff);
    bVar2 = CmdLineParserRoot::parseSwitch
                      (ArgKind_StringSwitch,&local_a8,(String *)&local_78,(String *)&local_58);
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_a8);
    if (bVar2) {
      pSVar3 = CmdLineSwitchTable::findSwitch(&local_78);
      if (pSVar3 == (SwitchInfo *)0x0) {
        pCVar4 = local_78.m_p;
        if (CONCAT71(local_78.m_length._1_7_,(undefined1)local_78.m_length) == 0) {
          pCVar4 = &StringDetailsImpl<char>::getEmptyString()::emptyString;
        }
        bVar2 = false;
        err::setFormatStringError("unknown switch --%s",pCVar4);
      }
      else {
        bVar2 = processSwitch(this,pSVar3,&local_78,&local_58);
      }
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = true;
    if (1 < local_80) {
      first = 1;
      local_88 = (CmdLineParser *)this;
      do {
        pSVar3 = CmdLineSwitchTable::findSwitch(arg->m_p[first]);
        if (pSVar3 == (SwitchInfo *)0x0) {
          bVar1 = false;
          err::setFormatStringError("unknown switch -%c");
          bVar2 = false;
        }
        else if (pSVar3->m_value == (char *)0x0) {
          switchKind = pSVar3->m_switchKind;
          local_a8.m_length._0_1_ = 0;
          local_a8.m_length._1_7_ = 0;
          local_a8.m_isNullTerminated = false;
          local_a8.m_p = (C *)0x0;
          local_a8.m_hdr._0_1_ = 0;
          local_a8.m_hdr._1_7_ = 0;
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                    (&local_a8,(BufHdr *)0x0);
          local_a8.m_p = (C *)0x0;
          local_a8.m_length._0_1_ = 0;
          local_a8.m_length._1_7_ = 0;
          local_a8.m_isNullTerminated = false;
          CmdLineParser::onSwitch(local_88,switchKind,&local_a8);
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_a8);
          bVar1 = true;
        }
        else {
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
                    (&local_a8,arg,first,0xffffffffffffffff);
          bVar2 = CmdLineParserRoot::parseSwitch
                            (argKind,&local_a8,(String *)&local_78,(String *)&local_58);
          if (bVar2) {
            bVar2 = processSwitch(&local_88->super_CmdLineParser<CmdLineParser,_CmdLineSwitchTable>,
                                  pSVar3,&local_78,&local_58);
          }
          else {
            bVar2 = false;
          }
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_a8);
          bVar1 = false;
        }
        if (!bVar1) goto LAB_0011f886;
        first = first + 1;
      } while (local_80 != first);
      bVar2 = true;
    }
  }
LAB_0011f886:
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_58);
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_78);
  return bVar2;
}

Assistant:

bool
	processArg(const sl::StringRef& arg) {
		bool result;

		T* self = static_cast<T*>(this);

		if (m_flags & Flag_Forward)
			return self->onValue(arg);

		sl::String switchName;
		sl::String value;

		ArgKind argKind = getArgKind(arg);
		switch (argKind) {
		case ArgKind_Value:
			return processValue(arg);

		case ArgKind_StringSwitch:
			result = parseSwitch(argKind, arg.getSubString(2), &switchName, &value);
			if (!result)
				return false;

			const SwitchInfo* switchInfo = SwitchTable::findSwitch(switchName);
			if (!switchInfo) {
				err::setFormatStringError("unknown switch --%s", switchName.sz());
				return false;
			}

			return processSwitch(switchInfo, switchName, value);
		}

		ASSERT(argKind == ArgKind_CharSwitch);

		size_t length = arg.getLength();
		for (size_t i = 1; i < length; i++) {
			const SwitchInfo* switchInfo = SwitchTable::findSwitch(arg[i]);
			if (!switchInfo) {
				err::setFormatStringError("unknown switch -%c", (uchar_t) arg [i]);
				return false;
			}

			if (switchInfo->m_value) {
				return
					parseSwitch(argKind, arg.getSubString(i), &switchName, &value) &&
					processSwitch(switchInfo, switchName, value);
			}

			result = self->onSwitch((SwitchKind)switchInfo->m_switchKind, NULL);
		}

		return true;
	}